

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5VtoVDelete(Fts5Tokenizer *pTok)

{
  int *in_RDI;
  Fts5VtoVTokenizer *p;
  
  if (in_RDI != (int *)0x0) {
    if (*in_RDI == 0) {
      (**(code **)(in_RDI + 4))(*(undefined8 *)(in_RDI + 0x10));
    }
    else {
      (**(code **)(in_RDI + 0xc))(*(undefined8 *)(in_RDI + 0x10));
    }
    sqlite3_free((void *)0x28d1dd);
  }
  return;
}

Assistant:

static void fts5VtoVDelete(Fts5Tokenizer *pTok){
  Fts5VtoVTokenizer *p = (Fts5VtoVTokenizer*)pTok;
  if( p ){
    if( p->bV2Native ){
      p->x2.xDelete(p->pReal);
    }else{
      p->x1.xDelete(p->pReal);
    }
    sqlite3_free(p);
  }
}